

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void gen_negv_mask(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 b,TCGv_i64 m)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andc_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),m,b);
  tcg_gen_andc_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),b,m);
  tcg_gen_sub_i64(tcg_ctx,d,m,(TCGv_i64)((long)ts - (long)tcg_ctx));
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_xor_i64,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(d + (long)tcg_ctx),(TCGArg)ts_00);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
  return;
}

Assistant:

static void gen_negv_mask(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 b, TCGv_i64 m)
{
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andc_i64(tcg_ctx, t3, m, b);
    tcg_gen_andc_i64(tcg_ctx, t2, b, m);
    tcg_gen_sub_i64(tcg_ctx, d, m, t2);
    tcg_gen_xor_i64(tcg_ctx, d, d, t3);

    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
}